

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

shared_ptr<const_void> __thiscall
pstore::database::get_spanning
          (database *this,address addr,size_t size,bool initialized,bool writable)

{
  anon_class_32_4_801fbb63_for__M_tp __d;
  uchar *__p;
  element_type *peVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined1 in_R9B;
  shared_ptr<const_void> sVar3;
  undefined1 local_60 [8];
  shared_ptr<unsigned_char> result;
  anon_class_32_4_801fbb63_for__M_tp deleter;
  bool writable_local;
  bool initialized_local;
  size_t size_local;
  database *this_local;
  address addr_local;
  
  uVar2 = CONCAT71(in_register_00000009,initialized);
  result.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr.a_;
  __p = (uchar *)operator_new__(uVar2);
  __d.addr.a_ = size;
  __d.this = (database *)
             result.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __d.size = uVar2;
  __d._24_8_ = CONCAT71(deleter.size._1_7_,in_R9B) & 0xffffffffffffff01;
  std::shared_ptr<unsigned_char>::
  shared_ptr<unsigned_char,pstore::database::get_spanning(pstore::address,unsigned_long,bool,bool)const::__0,void>
            ((shared_ptr<unsigned_char> *)local_60,__p,__d);
  if (writable) {
    peVar1 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    pstore::storage::
    copy<pstore::storage::copy_from_store_traits,pstore::database::get_spanning(pstore::address,unsigned_long,bool,bool)const::__1>
              ((storage *)(addr.a_ + 8),size,uVar2,peVar1);
  }
  std::static_pointer_cast<void_const,unsigned_char>((shared_ptr<unsigned_char> *)this);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)local_60);
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<const_void>)sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto database::get_spanning (address const addr, std::size_t const size, bool const initialized,
                                 bool const writable) const -> std::shared_ptr<void const> {
        // The deleter is called when the shared pointer that we're about to return is
        // released.
        auto deleter = [this, addr, size, writable] (std::uint8_t * const p) {
            if (writable) {
                // Check that this code is not trying to write back to read-only storage. This error
                // can occur if a non-const pointer is being destroyed after the containing
                // transaction has been committed.
                PSTORE_ASSERT (addr >= this->first_writable_address ());

                // If we're returning a writable pointer then we must copy the (potentially
                // modified) contents back to the data store.
                storage_.copy<storage::copy_to_store_traits> (
                    addr, size, p,
                    [] (std::uint8_t * const dest, std::uint8_t const * const src,
                        std::size_t const n) { std::memcpy (dest, src, n); });
            }
            delete[] p;
        };

        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        std::shared_ptr<std::uint8_t> const result{new std::uint8_t[size], deleter};

        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return std::static_pointer_cast<void const> (result);
    }